

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.h
# Opt level: O0

int64_t __thiscall icu_63::CollationIterator::nextCE(CollationIterator *this,UErrorCode *errorCode)

{
  int iVar1;
  UBool UVar2;
  int64_t iVar3;
  CollationData *local_38;
  CollationData *d;
  uint32_t local_28;
  uint32_t t;
  uint32_t ce32;
  UChar32 c;
  UErrorCode *errorCode_local;
  CollationIterator *this_local;
  
  _ce32 = errorCode;
  errorCode_local = (UErrorCode *)this;
  if (this->cesIndex < (this->ceBuffer).length) {
    iVar1 = this->cesIndex;
    this->cesIndex = iVar1 + 1;
    this_local = (CollationIterator *)CEBuffer::get(&this->ceBuffer,iVar1);
  }
  else {
    UVar2 = CEBuffer::incLength(&this->ceBuffer,errorCode);
    if (UVar2 == '\0') {
      this_local = (CollationIterator *)0x101000100;
    }
    else {
      local_28 = (*(this->super_UObject)._vptr_UObject[8])(this,&t,_ce32);
      d._4_4_ = local_28 & 0xff;
      if (d._4_4_ < 0xc0) {
        iVar1 = this->cesIndex;
        this->cesIndex = iVar1 + 1;
        this_local = (CollationIterator *)
                     CEBuffer::set(&this->ceBuffer,iVar1,
                                   CONCAT44(local_28,(local_28 & 0xff00) << 0x10) &
                                   0xffff0000ffffffff | (ulong)(d._4_4_ << 8));
      }
      else {
        if (d._4_4_ == 0xc0) {
          if ((int)t < 0) {
            iVar1 = this->cesIndex;
            this->cesIndex = iVar1 + 1;
            iVar3 = CEBuffer::set(&this->ceBuffer,iVar1,0x101000100);
            return iVar3;
          }
          local_38 = this->data->base;
          local_28 = CollationData::getCE32(local_38,t);
          d._4_4_ = local_28 & 0xff;
          if (d._4_4_ < 0xc0) {
            iVar1 = this->cesIndex;
            this->cesIndex = iVar1 + 1;
            iVar3 = CEBuffer::set(&this->ceBuffer,iVar1,
                                  CONCAT44(local_28,(local_28 & 0xff00) << 0x10) &
                                  0xffff0000ffffffff | (ulong)(d._4_4_ << 8));
            return iVar3;
          }
        }
        else {
          local_38 = this->data;
        }
        if (d._4_4_ == 0xc1) {
          iVar1 = this->cesIndex;
          this->cesIndex = iVar1 + 1;
          this_local = (CollationIterator *)
                       CEBuffer::set(&this->ceBuffer,iVar1,
                                     (ulong)(local_28 - 0xc1) << 0x20 | 0x5000500);
        }
        else {
          this_local = (CollationIterator *)nextCEFromCE32(this,local_38,t,local_28,_ce32);
        }
      }
    }
  }
  return (int64_t)this_local;
}

Assistant:

inline int64_t nextCE(UErrorCode &errorCode) {
        if(cesIndex < ceBuffer.length) {
            // Return the next buffered CE.
            return ceBuffer.get(cesIndex++);
        }
        // assert cesIndex == ceBuffer.length;
        if(!ceBuffer.incLength(errorCode)) {
            return Collation::NO_CE;
        }
        UChar32 c;
        uint32_t ce32 = handleNextCE32(c, errorCode);
        uint32_t t = ce32 & 0xff;
        if(t < Collation::SPECIAL_CE32_LOW_BYTE) {  // Forced-inline of isSpecialCE32(ce32).
            // Normal CE from the main data.
            // Forced-inline of ceFromSimpleCE32(ce32).
            return ceBuffer.set(cesIndex++,
                    ((int64_t)(ce32 & 0xffff0000) << 32) | ((ce32 & 0xff00) << 16) | (t << 8));
        }
        const CollationData *d;
        // The compiler should be able to optimize the previous and the following
        // comparisons of t with the same constant.
        if(t == Collation::SPECIAL_CE32_LOW_BYTE) {
            if(c < 0) {
                return ceBuffer.set(cesIndex++, Collation::NO_CE);
            }
            d = data->base;
            ce32 = d->getCE32(c);
            t = ce32 & 0xff;
            if(t < Collation::SPECIAL_CE32_LOW_BYTE) {
                // Normal CE from the base data.
                return ceBuffer.set(cesIndex++,
                        ((int64_t)(ce32 & 0xffff0000) << 32) | ((ce32 & 0xff00) << 16) | (t << 8));
            }
        } else {
            d = data;
        }
        if(t == Collation::LONG_PRIMARY_CE32_LOW_BYTE) {
            // Forced-inline of ceFromLongPrimaryCE32(ce32).
            return ceBuffer.set(cesIndex++,
                    ((int64_t)(ce32 - t) << 32) | Collation::COMMON_SEC_AND_TER_CE);
        }
        return nextCEFromCE32(d, c, ce32, errorCode);
    }